

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# reuse_async_url_session.hpp
# Opt level: O1

bool __thiscall
m2d::savanna::ssl_reuse::
reuse_async_request_executor<boost::beast::http::basic_dynamic_body<boost::beast::basic_multi_buffer<std::allocator<char>_>_>_>
::completion_callback
          (reuse_async_request_executor<boost::beast::http::basic_dynamic_body<boost::beast::basic_multi_buffer<std::allocator<char>_>_>_>
           *this,result<boost::beast::http::message<false,_boost::beast::http::basic_dynamic_body<boost::beast::basic_multi_buffer<std::allocator<char>_>_>,_boost::beast::http::basic_fields<std::allocator<char>_>_>_>
                 *result)

{
  bool bVar1;
  string_view sVar2;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> location;
  url new_url;
  undefined1 *local_290;
  long local_288;
  undefined1 local_280 [16];
  string local_270;
  string local_250;
  string local_230;
  string local_210;
  string local_1f0;
  url local_1d0;
  result<boost::beast::http::message<false,_boost::beast::http::basic_dynamic_body<boost::beast::basic_multi_buffer<std::allocator<char>_>_>,_boost::beast::http::basic_fields<std::allocator<char>_>_>_>
  local_110;
  
  if ((result->error).super_type.m_initialized == false) {
    if ((result->response).super_type.m_initialized == false) goto LAB_0011a1be;
    if ((*(int *)((long)&(result->response).super_type.m_storage.dummy_ + 0x5c) - 300U < 100) &&
       (this->follow_location_ == true)) {
      sVar2.len_ = 8;
      sVar2.ptr_ = "Location";
      sVar2 = boost::beast::http::basic_fields<std::allocator<char>_>::operator[]
                        ((basic_fields<std::allocator<char>_> *)
                         &(result->response).super_type.m_storage,sVar2);
      local_290 = local_280;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_290,sVar2.ptr_,sVar2.ptr_ + sVar2.len_);
      local_230._M_dataplus._M_p = (pointer)&local_230.field_2;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_230,local_290,local_290 + local_288);
      url::url(&local_1d0,&local_230);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_230._M_dataplus._M_p != &local_230.field_2) {
        operator_delete(local_230._M_dataplus._M_p);
      }
      url::to_string_abi_cxx11_(&local_1f0,&local_1d0);
      local_250._M_dataplus._M_p = (pointer)&local_250.field_2;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_250,local_1d0.host_._M_dataplus._M_p,
                 local_1d0.host_._M_dataplus._M_p + local_1d0.host_._M_string_length);
      update_request(this,&this->original_request_,&local_1f0,&local_250);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_250._M_dataplus._M_p != &local_250.field_2) {
        operator_delete(local_250._M_dataplus._M_p);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_1f0._M_dataplus._M_p != &local_1f0.field_2) {
        operator_delete(local_1f0._M_dataplus._M_p);
      }
      local_270._M_dataplus._M_p = (pointer)&local_270.field_2;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_270,local_1d0.host_._M_dataplus._M_p,
                 local_1d0.host_._M_dataplus._M_p + local_1d0.host_._M_string_length);
      url::port_str_abi_cxx11_(&local_210,&local_1d0);
      run(this,&local_270,&local_210);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_210._M_dataplus._M_p != &local_210.field_2) {
        operator_delete(local_210._M_dataplus._M_p);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_270._M_dataplus._M_p != &local_270.field_2) {
        operator_delete(local_270._M_dataplus._M_p);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_1d0.fragment_._M_dataplus._M_p != &local_1d0.fragment_.field_2) {
        operator_delete(local_1d0.fragment_._M_dataplus._M_p);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_1d0.query_._M_dataplus._M_p != &local_1d0.query_.field_2) {
        operator_delete(local_1d0.query_._M_dataplus._M_p);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_1d0.path_._M_dataplus._M_p != &local_1d0.path_.field_2) {
        operator_delete(local_1d0.path_._M_dataplus._M_p);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_1d0.port_._M_dataplus._M_p != &local_1d0.port_.field_2) {
        operator_delete(local_1d0.port_._M_dataplus._M_p);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_1d0.host_._M_dataplus._M_p != &local_1d0.host_.field_2) {
        operator_delete(local_1d0.host_._M_dataplus._M_p);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_1d0.scheme_._M_dataplus._M_p != &local_1d0.scheme_.field_2) {
        operator_delete(local_1d0.scheme_._M_dataplus._M_p);
      }
      if (local_290 != local_280) {
        operator_delete(local_290);
      }
      return false;
    }
  }
  local_110.response.super_type.m_initialized = false;
  bVar1 = (result->response).super_type.m_initialized == true;
  if (bVar1) {
    boost::beast::http::
    message<false,_boost::beast::http::basic_dynamic_body<boost::beast::basic_multi_buffer<std::allocator<char>_>_>,_boost::beast::http::basic_fields<std::allocator<char>_>_>
    ::message((message<false,_boost::beast::http::basic_dynamic_body<boost::beast::basic_multi_buffer<std::allocator<char>_>_>,_boost::beast::http::basic_fields<std::allocator<char>_>_>
               *)&local_110.response.super_type.m_storage,
              (message<false,_boost::beast::http::basic_dynamic_body<boost::beast::basic_multi_buffer<std::allocator<char>_>_>,_boost::beast::http::basic_fields<std::allocator<char>_>_>
               *)&(result->response).super_type.m_storage);
  }
  local_110.error.super_type.m_initialized = false;
  local_110.response.super_type.m_initialized = bVar1;
  if ((result->error).super_type.m_initialized == true) {
    boost::optional_detail::optional_base<boost::system::system_error>::construct
              (&local_110.error.super_type,(argument_type)&(result->error).super_type.m_storage);
  }
  if ((this->completion_).super__Function_base._M_manager != (_Manager_type)0x0) {
    (*(this->completion_)._M_invoker)((_Any_data *)&this->completion_,&local_110);
    if (local_110.error.super_type.m_initialized == true) {
      boost::system::system_error::~system_error
                ((system_error *)&local_110.error.super_type.m_storage);
      local_110.error.super_type.m_initialized = false;
    }
    boost::optional_detail::
    optional_base<boost::beast::http::message<false,_boost::beast::http::basic_dynamic_body<boost::beast::basic_multi_buffer<std::allocator<char>_>_>,_boost::beast::http::basic_fields<std::allocator<char>_>_>_>
    ::~optional_base((optional_base<boost::beast::http::message<false,_boost::beast::http::basic_dynamic_body<boost::beast::basic_multi_buffer<std::allocator<char>_>_>,_boost::beast::http::basic_fields<std::allocator<char>_>_>_>
                      *)&local_110);
    return true;
  }
  std::__throw_bad_function_call();
LAB_0011a1be:
  __assert_fail("this->is_initialized()","/usr/include/boost/optional/optional.hpp",0x4c6,
                "pointer_type boost::optional<boost::beast::http::message<false, boost::beast::http::basic_dynamic_body<boost::beast::basic_multi_buffer<std::allocator<char>>>>>::operator->() [T = boost::beast::http::message<false, boost::beast::http::basic_dynamic_body<boost::beast::basic_multi_buffer<std::allocator<char>>>>]"
               );
}

Assistant:

bool completion_callback(savanna::result<http::response<http::dynamic_body>> result) override {
			if (!result.error) {
				if ((result.response->result_int() >= 300) && result.response->result_int() < 400 && follow_location_) {
					auto location = result.response->base()["Location"].to_string();
					auto new_url = savanna::url(location);
					update_request(original_request_, new_url.to_string(), new_url.host());
					run(new_url.host(), new_url.port_str());
					return false;
				}
			}
			completion_(result);
			return true;
		}